

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937_64.hpp
# Opt level: O1

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,parameter_type *P)

{
  undefined4 uVar1;
  basic_istream<char,_std::char_traits<char>_> *in_00;
  delim_c local_12;
  delim_c local_11;
  
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  in_00 = utility::operator>>(in,&local_11);
  utility::operator>>(in_00,&local_12);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, parameter_type &P) {
        parameter_type P_new;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> utility::delim(')');
        if (in)
          P = P_new;
        in.flags(flags);
        return in;
      }